

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

void doaltarobj(obj *obj)

{
  obj *poVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int local_2c;
  int buccount;
  obj *otmp_nobj;
  obj *otmp2;
  obj *otmp;
  obj *obj_local;
  
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    u.uconduct.gnostic = u.uconduct.gnostic + 1;
    otmp = obj;
    if ((((*(uint *)&obj->field_0x4a >> 1 & 1) == 0) && ((*(uint *)&obj->field_0x4a & 1) == 0)) ||
       (obj->oclass == '\f')) {
      pcVar6 = Doname2(obj);
      pcVar4 = otense(otmp,"land");
      pline("%s %s on the altar.",pcVar6,pcVar4);
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffbf | 0x40;
    }
    else {
      pcVar6 = "black";
      if ((*(uint *)&obj->field_0x4a >> 1 & 1) != 0) {
        pcVar6 = "amber";
      }
      pcVar6 = hcolor(pcVar6);
      pcVar6 = an(pcVar6);
      pcVar4 = doname(otmp);
      pcVar5 = otense(otmp,"hit");
      pline("There is %s flash as %s %s the altar.",pcVar6,pcVar4,pcVar5);
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffbf | 0x40;
      }
    }
    if (otmp->cobj != (obj *)0x0) {
      local_2c = 0;
      poVar1 = otmp->cobj;
      while (otmp2 = poVar1, otmp2 != (obj *)0x0) {
        poVar1 = otmp2->nobj;
        if (((*(uint *)&otmp2->field_0x4a >> 1 & 1) != 0) ||
           ((*(uint *)&otmp2->field_0x4a & 1) != 0)) {
          local_2c = local_2c + 1;
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
          *(uint *)&otmp2->field_0x4a = *(uint *)&otmp2->field_0x4a & 0xffffffbf | 0x40;
          otmp_nobj = otmp->cobj;
          while ((otmp_nobj != (obj *)0x0 &&
                 ((otmp_nobj == otmp2 || (iVar3 = merged(&otmp_nobj,&otmp2), iVar3 == 0))))) {
            otmp_nobj = otmp_nobj->nobj;
          }
        }
      }
      if (local_2c == 1) {
        pcVar6 = xname(otmp);
        pcVar6 = the(pcVar6);
        pline("Looking inside %s, you see a colored flash.",pcVar6);
      }
      else if (1 < local_2c) {
        pcVar6 = xname(otmp);
        pcVar6 = the(pcVar6);
        pline("Looking inside %s, you see colored flashes.",pcVar6);
      }
    }
  }
  return;
}

Assistant:

void doaltarobj(struct obj *obj)  /* obj is an object dropped on an altar */
{
	if (Blind)
		return;

	/* KMH, conduct */
	u.uconduct.gnostic++;

	if ((obj->blessed || obj->cursed) && obj->oclass != COIN_CLASS) {
		pline("There is %s flash as %s %s the altar.",
			an(hcolor(obj->blessed ? "amber" : "black")),
			doname(obj), otense(obj, "hit"));
		if (!Hallucination) obj->bknown = 1;
	} else {
		pline("%s %s on the altar.", Doname2(obj),
			otense(obj, "land"));
		obj->bknown = 1;
	}

	/* Also BUC one level deep inside containers. */
	if (Has_contents(obj)) {
	    struct obj *otmp, *otmp2, *otmp_nobj;
	    int buccount = 0;
	    for (otmp = obj->cobj; otmp; ) {
		/* Ensure next otmp in case otmp is merged
		 * and thus freed and unusable. */
		otmp_nobj = otmp->nobj;
		if (otmp->blessed || otmp->cursed)
		    buccount++;
		if (!Hallucination) {
		    otmp->bknown = 1;
		    /* Merge obj with a contained object if possible,
		     * so objects of the same BUC but different BUC-known state
		     * don't form separate stacks in the container. */
		    for (otmp2 = obj->cobj; otmp2; otmp2 = otmp2->nobj)
			if (otmp2 != otmp && merged(&otmp2, &otmp))
			    break;
		}
		otmp = otmp_nobj;
	    }
	    if (buccount == 1) {
		pline("Looking inside %s, you see a colored flash.",
		      the(xname(obj)));
	    } else if (buccount > 1) {
		pline("Looking inside %s, you see colored flashes.",
		      the(xname(obj)));
	    }
	}
}